

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::minimize_clause(Internal *this)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  reference puVar4;
  reference piVar5;
  time_t *in_RSI;
  time_t *__timer;
  vector<int,_std::allocator<int>_> *in_RDI;
  double s;
  double s_00;
  reverse_iterator p_1;
  unsigned_long p;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4;
  vector<int,_std::allocator<int>_> stack;
  iterator i;
  iterator j;
  iterator end;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef8;
  Internal *pIVar6;
  Internal *in_stack_ffffffffffffff00;
  Profile *profile;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff08;
  pointer *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  Internal *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  int in_stack_ffffffffffffff6c;
  Internal *in_stack_ffffffffffffff70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  unsigned_long local_68;
  unsigned_long *local_60;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_58;
  pointer *local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  int *local_18;
  int *local_10;
  
  if (in_RDI[0x12e].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[0x636] <=
      in_RDI[0x12e].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[0x386]) {
    pIVar6 = (Internal *)
             in_RDI[0x12e].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = in_RDI[0x12e].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    time((Internal *)
         in_RDI[0x12e].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start,in_RSI);
    start_profiling(pIVar6,(Profile *)(piVar2 + 0x62e),s);
  }
  External::check_learned_clause((External *)in_stack_ffffffffffffff00);
  minimize_sort_clause(in_stack_ffffffffffffff40);
  local_10 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffef8);
  local_20._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffef8);
  local_18 = local_20._M_current;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xdd29c3);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_ffffffffffffff00,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_fffffffffffffef8), bVar3) {
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_20);
    in_stack_ffffffffffffff4f =
         minimize_literal((Internal *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                          (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                          (int)in_stack_ffffffffffffff40);
    if ((bool)in_stack_ffffffffffffff4f) {
      if (((ulong)in_RDI[0xd].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish & 1) != 0) {
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (&local_20);
        calculate_minimize_chain(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_RDI);
        local_50 = &in_RDI[8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        local_58._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffef8);
        local_60 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffef8);
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)in_stack_ffffffffffffff00,
                                  (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)in_stack_fffffffffffffef8), bVar3) {
          puVar4 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_58);
          local_68 = *puVar4;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffff10,(value_type_conflict5 *)in_stack_ffffffffffffff08);
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&local_58);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xdd2b1b);
      }
      in_RDI[0xd7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((long)in_RDI[0xd7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + 1);
    }
    else {
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_20);
      iVar1 = *piVar5;
      local_70 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_ffffffffffffff08,
                            (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_70);
      *piVar5 = iVar1;
      in_stack_ffffffffffffff40 =
           (Internal *)
           flags(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      in_stack_ffffffffffffff40->mode = in_stack_ffffffffffffff40->mode & 0xfffffffdU | 2;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  bVar3 = __gnu_cxx::operator!=
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff00,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_fffffffffffffef8);
  if (bVar3) {
    std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffef8);
    __gnu_cxx::operator-
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff00,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffef8);
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  clear_minimized_literals(in_stack_ffffffffffffff40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::rbegin(in_stack_ffffffffffffff08);
  while( true ) {
    __timer = (time_t *)&stack0xffffffffffffff70;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::rend(in_stack_ffffffffffffff08);
    bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)in_stack_ffffffffffffff00,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)in_stack_fffffffffffffef8);
    if (!bVar3) break;
    in_stack_ffffffffffffff10 =
         &in_RDI[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_ffffffffffffff00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff10,
               (value_type_conflict5 *)in_stack_ffffffffffffff08);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xdd2cd9);
  if (in_RDI[0x12e].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[0x636] <=
      in_RDI[0x12e].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[0x386]) {
    pIVar6 = (Internal *)
             in_RDI[0x12e].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    profile = &(pIVar6->profiles).minimize;
    time(pIVar6,__timer);
    stop_profiling(pIVar6,profile,s_00);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10);
  return;
}

Assistant:

void Internal::minimize_clause () {
  START (minimize);
  LOG (clause, "minimizing first UIP clause");

  external->check_learned_clause (); // check 1st UIP learned clause first
  minimize_sort_clause ();

  assert (minimized.empty ());
  assert (minimize_chain.empty ());
  const auto end = clause.end ();
  auto j = clause.begin (), i = j;
  std::vector<int> stack;
  for (; i != end; i++) {
    if (minimize_literal (-*i)) {
      if (lrat) {
        assert (mini_chain.empty ());
        calculate_minimize_chain (-*i, stack);
        for (auto p : mini_chain) {
          minimize_chain.push_back (p);
        }
        mini_chain.clear ();
      }
      stats.minimized++;
    } else
      flags (*j++ = *i).keep = true;
  }
  LOG ("minimized %zd literals", (size_t) (clause.end () - j));
  if (j != end)
    clause.resize (j - clause.begin ());
  clear_minimized_literals ();
  for (auto p = minimize_chain.rbegin (); p != minimize_chain.rend ();
       p++) {
    lrat_chain.push_back (*p);
  }
  minimize_chain.clear ();
  STOP (minimize);
}